

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_pcache * pcache1Create(int szPage,int szExtra,int bPurgeable)

{
  bool bVar1;
  sqlite3_pcache *psVar2;
  int separateCache;
  int sz;
  PGroup *pGroup;
  PCache1 *pCache;
  int bPurgeable_local;
  int szExtra_local;
  int szPage_local;
  
  bVar1 = 0 < sqlite3Config.bCoreMutex;
  psVar2 = (sqlite3_pcache *)sqlite3MallocZero((uint)bVar1 * 0x28 + 0x38);
  if (psVar2 != (sqlite3_pcache *)0x0) {
    if (bVar1 == 0) {
      _separateCache = &pcache1_g;
    }
    else {
      _separateCache = (PCacheGlobal *)(psVar2 + 0x38);
      *(undefined4 *)(psVar2 + 0x48) = 10;
    }
    *(PCacheGlobal **)psVar2 = _separateCache;
    *(int *)(psVar2 + 8) = szPage;
    *(int *)(psVar2 + 0xc) = szExtra;
    *(uint *)(psVar2 + 0x10) = (uint)(bPurgeable != 0);
    if (bPurgeable != 0) {
      *(undefined4 *)(psVar2 + 0x14) = 10;
      sqlite3_mutex_enter((_separateCache->grp).mutex);
      (_separateCache->grp).nMinPage = *(int *)(psVar2 + 0x14) + (_separateCache->grp).nMinPage;
      (_separateCache->grp).mxPinned =
           ((_separateCache->grp).nMaxPage + 10) - (_separateCache->grp).nMinPage;
      sqlite3_mutex_leave((_separateCache->grp).mutex);
    }
  }
  return psVar2;
}

Assistant:

static sqlite3_pcache *pcache1Create(int szPage, int szExtra, int bPurgeable){
  PCache1 *pCache;      /* The newly created page cache */
  PGroup *pGroup;       /* The group the new page cache will belong to */
  int sz;               /* Bytes of memory required to allocate the new cache */

  /*
  ** The seperateCache variable is true if each PCache has its own private
  ** PGroup.  In other words, separateCache is true for mode (1) where no
  ** mutexing is required.
  **
  **   *  Always use a unified cache (mode-2) if ENABLE_MEMORY_MANAGEMENT
  **
  **   *  Always use a unified cache in single-threaded applications
  **
  **   *  Otherwise (if multi-threaded and ENABLE_MEMORY_MANAGEMENT is off)
  **      use separate caches (mode-1)
  */
#if defined(SQLITE_ENABLE_MEMORY_MANAGEMENT) || SQLITE_THREADSAFE==0
  const int separateCache = 0;
#else
  int separateCache = sqlite3GlobalConfig.bCoreMutex>0;
#endif

  assert( (szPage & (szPage-1))==0 && szPage>=512 && szPage<=65536 );
  assert( szExtra < 300 );

  sz = sizeof(PCache1) + sizeof(PGroup)*separateCache;
  pCache = (PCache1 *)sqlite3MallocZero(sz);
  if( pCache ){
    if( separateCache ){
      pGroup = (PGroup*)&pCache[1];
      pGroup->mxPinned = 10;
    }else{
      pGroup = &pcache1.grp;
    }
    pCache->pGroup = pGroup;
    pCache->szPage = szPage;
    pCache->szExtra = szExtra;
    pCache->bPurgeable = (bPurgeable ? 1 : 0);
    if( bPurgeable ){
      pCache->nMin = 10;
      pcache1EnterMutex(pGroup);
      pGroup->nMinPage += pCache->nMin;
      pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
      pcache1LeaveMutex(pGroup);
    }
  }
  return (sqlite3_pcache *)pCache;
}